

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O1

Import * __thiscall flatbuffers::python::Imports::Import(Imports *this,string *module)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pIVar3;
  Import import;
  Import local_58;
  
  paVar1 = &local_58.module.field_2;
  local_58.module._M_string_length = 0;
  local_58.module.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_58.name.field_2;
  local_58.name._M_string_length = 0;
  local_58.name.field_2._M_local_buf[0] = '\0';
  local_58.module._M_dataplus._M_p = (pointer)paVar1;
  local_58.name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_assign((string *)&local_58);
  std::vector<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>::
  emplace_back<flatbuffers::python::Import>(&this->imports,&local_58);
  pIVar3 = (this->imports).
           super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.name._M_dataplus._M_p,
                    CONCAT71(local_58.name.field_2._M_allocated_capacity._1_7_,
                             local_58.name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.module._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.module._M_dataplus._M_p,
                    CONCAT71(local_58.module.field_2._M_allocated_capacity._1_7_,
                             local_58.module.field_2._M_local_buf[0]) + 1);
  }
  return pIVar3 + -1;
}

Assistant:

const python::Import &python::Imports::Import(const std::string &module) {
  python::Import import;
  import.module = module;
  imports.push_back(std::move(import));
  return imports.back();
}